

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::SetI2P(CNetAddr *this,string *addr)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string_view str;
  string_view str_00;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> address_bytes;
  string b32_padded;
  undefined1 local_b0 [32];
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if (addr->_M_string_length == 0x3c) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,addr,0x34,0xffffffffffffffff);
    str._M_str = local_70._M_dataplus._M_p;
    str._M_len = local_70._M_string_length;
    ToLower_abi_cxx11_(&local_50,str);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_50,".b32.i2p");
    bVar4 = iVar1 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,addr,0,
               0x34);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b0,"====");
    local_90 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90 == paVar3) {
      local_80 = paVar3->_M_allocated_capacity;
      uStack_78 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_90 = &local_80;
    }
    else {
      local_80 = paVar3->_M_allocated_capacity;
    }
    local_88 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    str_00._M_str = (char *)local_90;
    str_00._M_len = local_88;
    DecodeBase32((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_b0,
                 str_00);
    if ((local_b0[0x18] == '\x01') && (local_b0._8_8_ - local_b0._0_8_ == 0x20)) {
      this->m_net = NET_I2P;
      bVar4 = true;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::
      assign<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                (&this->m_addr,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_b0._0_8_,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_b0._8_8_);
    }
    else {
      bVar4 = false;
    }
    if ((local_b0[0x18] == '\x01') &&
       (local_b0[0x18] = '\0', (uchar *)local_b0._0_8_ != (uchar *)0x0)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::SetI2P(const std::string& addr)
{
    // I2P addresses that we support consist of 52 base32 characters + ".b32.i2p".
    static constexpr size_t b32_len{52};
    static const char* suffix{".b32.i2p"};
    static constexpr size_t suffix_len{8};

    if (addr.size() != b32_len + suffix_len || ToLower(addr.substr(b32_len)) != suffix) {
        return false;
    }

    // Remove the ".b32.i2p" suffix and pad to a multiple of 8 chars, so DecodeBase32()
    // can decode it.
    const std::string b32_padded = addr.substr(0, b32_len) + "====";

    auto address_bytes = DecodeBase32(b32_padded);

    if (!address_bytes || address_bytes->size() != ADDR_I2P_SIZE) {
        return false;
    }

    m_net = NET_I2P;
    m_addr.assign(address_bytes->begin(), address_bytes->end());

    return true;
}